

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

void __thiscall llvm::Triple::setOSAndEnvironmentName(Triple *this,StringRef Str)

{
  Child LHS;
  Child CVar1;
  Child CVar2;
  Child CVar3;
  NodeKind NVar4;
  Child CVar5;
  Child CVar6;
  Child local_108 [2];
  undefined2 local_f8;
  undefined6 uStack_f6;
  Child local_e8 [2];
  undefined2 local_d8;
  undefined6 uStack_d6;
  Twine local_c8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  NodeKind local_98;
  char cStack_97;
  undefined6 uStack_96;
  uint local_90;
  undefined4 uStack_8c;
  NodeKind local_80;
  char cStack_7f;
  undefined6 uStack_7e;
  uint local_78;
  undefined4 uStack_74;
  NodeKind local_68;
  char cStack_67;
  undefined6 uStack_66;
  uint local_60;
  undefined4 uStack_5c;
  NodeKind local_50;
  char cStack_4f;
  undefined6 uStack_4e;
  StringRef local_48;
  StringRef local_38;
  StringRef local_28;
  
  local_48.Length = Str.Length;
  local_48.Data = Str.Data;
  local_28 = getArchName(this);
  Twine::Twine((Twine *)&local_60,&local_28,"-");
  local_38 = getVendorName(this);
  Twine::Twine((Twine *)&local_78,&local_38);
  if ((local_50 == NullKind) || (local_68 == NullKind)) {
    local_f8 = 0x100;
  }
  else if (local_50 == EmptyKind) {
    local_f8._1_1_ = cStack_67;
    local_f8._0_1_ = local_68;
    uStack_f6 = uStack_66;
    local_108[0]._0_4_ = local_78;
    local_108[0]._4_4_ = uStack_74;
  }
  else if (local_68 == EmptyKind) {
    local_f8._1_1_ = cStack_4f;
    local_f8._0_1_ = local_50;
    uStack_f6 = uStack_4e;
    local_108[0]._0_4_ = local_60;
    local_108[0]._4_4_ = uStack_5c;
  }
  else {
    CVar5._4_4_ = uStack_5c;
    CVar5.decUI = local_60;
    if (cStack_4f != '\x01') {
      local_50 = TwineKind;
      CVar5.twine = (Twine *)&local_60;
    }
    if (cStack_67 != '\x01') {
      local_68 = TwineKind;
    }
    CVar3._4_4_ = uStack_74;
    CVar3.decUI = local_78;
    CVar6.twine = (Twine *)&local_78;
    if (cStack_67 == '\x01') {
      CVar6 = CVar3;
    }
    Twine::Twine((Twine *)local_108,CVar5,local_50,CVar6,local_68);
  }
  Twine::Twine((Twine *)&local_90,"-");
  if (((NodeKind)local_f8 == NullKind) || (local_80 == NullKind)) {
    local_d8 = 0x100;
  }
  else if ((NodeKind)local_f8 == EmptyKind) {
    local_d8._1_1_ = cStack_7f;
    local_d8._0_1_ = local_80;
    uStack_d6 = uStack_7e;
    local_e8[0]._0_4_ = local_90;
    local_e8[0]._4_4_ = uStack_8c;
  }
  else if (local_80 == EmptyKind) {
    local_d8._0_1_ = (NodeKind)local_f8;
    local_d8._1_1_ = local_f8._1_1_;
    uStack_d6 = uStack_f6;
    local_e8[0].decUI = local_108[0].decUI;
    local_e8[0]._4_4_ = local_108[0]._4_4_;
  }
  else {
    CVar6._4_4_ = local_108[0]._4_4_;
    CVar6.decUI = local_108[0].decUI;
    NVar4 = (NodeKind)local_f8;
    if (local_f8._1_1_ != EmptyKind) {
      CVar6.twine = (Twine *)local_108;
      NVar4 = TwineKind;
    }
    if (cStack_7f != '\x01') {
      local_80 = TwineKind;
    }
    CVar2._4_4_ = uStack_8c;
    CVar2.decUI = local_90;
    CVar5.twine = (Twine *)&local_90;
    if (cStack_7f == '\x01') {
      CVar5 = CVar2;
    }
    Twine::Twine((Twine *)local_e8,CVar6,NVar4,CVar5,local_80);
  }
  Twine::Twine((Twine *)&local_a8,&local_48);
  if (((NodeKind)local_d8 == NullKind) || (local_98 == NullKind)) {
    local_c8._16_2_ = 0x100;
  }
  else if ((NodeKind)local_d8 == EmptyKind) {
    local_c8.RHSKind = cStack_97;
    local_c8.LHSKind = local_98;
    local_c8._18_6_ = uStack_96;
  }
  else if (local_98 == EmptyKind) {
    local_c8.LHSKind = (NodeKind)local_d8;
    local_c8.RHSKind = local_d8._1_1_;
    local_c8._18_6_ = uStack_d6;
  }
  else {
    LHS._4_4_ = local_e8[0]._4_4_;
    LHS.decUI = local_e8[0].decUI;
    NVar4 = (NodeKind)local_d8;
    if (local_d8._1_1_ != EmptyKind) {
      LHS.twine = (Twine *)local_e8;
      NVar4 = TwineKind;
    }
    if (cStack_97 != '\x01') {
      local_98 = TwineKind;
    }
    CVar1._4_4_ = uStack_a4;
    CVar1.decUI = local_a8;
    CVar5.twine = (Twine *)&local_a8;
    if (cStack_97 == '\x01') {
      CVar5 = CVar1;
    }
    Twine::Twine(&local_c8,LHS,NVar4,CVar5,local_98);
  }
  setTriple(this,&local_c8);
  return;
}

Assistant:

void Triple::setOSAndEnvironmentName(StringRef Str) {
  setTriple(getArchName() + "-" + getVendorName() + "-" + Str);
}